

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O3

bool __thiscall cmParsePHPCoverage::ReadArraySize(cmParsePHPCoverage *this,istream *in,int *size)

{
  char c;
  
  std::istream::get((char *)in);
  return false;
}

Assistant:

bool cmParsePHPCoverage::ReadArraySize(std::istream& in, int& size)
{
  char c = 0;
  in.get(c);
  if(c != 'a')
    {
    return false;
    }
  if(in.get(c) && c == ':')
    {
    if(this->ReadInt(in, size))
      {
      return true;
      }
    }
  return false;
}